

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

dtime_t __thiscall
duckdb::Interpolator<false>::
Operation<duckdb::dtime_t,duckdb::dtime_t,duckdb::QuantileDirect<duckdb::dtime_t>>
          (Interpolator<false> *this,dtime_t *v_t,Vector *result,
          QuantileDirect<duckdb::dtime_t> *accessor)

{
  idx_t iVar1;
  idx_t iVar2;
  idx_t iVar3;
  dtime_t dVar4;
  long lVar5;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<duckdb::dtime_t>_>_> __comp;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<duckdb::dtime_t>_>_> __comp_00;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<duckdb::dtime_t>_>_> __comp_01;
  dtime_t dVar6;
  bool bVar7;
  ulong uVar8;
  double dVar9;
  undefined1 auVar10 [16];
  dtime_t result_1;
  string local_48;
  dtime_t local_28;
  
  bVar7 = this->desc;
  iVar1 = this->FRN;
  iVar2 = this->begin;
  iVar3 = this->end;
  local_48._M_dataplus._M_p = (pointer)accessor;
  local_48._M_string_length = (size_type)accessor;
  local_48.field_2._M_local_buf[0] = bVar7;
  if (this->CRN == iVar1) {
    if (iVar1 != iVar3 && iVar2 != iVar3) {
      uVar8 = (long)(iVar3 * 8 + iVar2 * -8) >> 3;
      lVar5 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      __comp._M_comp._17_7_ = local_48.field_2._M_allocated_capacity._1_7_;
      __comp._M_comp.desc = bVar7;
      __comp._M_comp.accessor_r = accessor;
      __comp._M_comp.accessor_l = accessor;
      std::
      __introselect<duckdb::dtime_t*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<duckdb::dtime_t>>>>
                (v_t + iVar2,v_t + iVar1,v_t + iVar3,(ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,__comp
                );
    }
    dVar4.micros = v_t[this->FRN].micros;
    bVar7 = duckdb::TryCast::Operation<duckdb::dtime_t,duckdb::dtime_t>(dVar4,&local_28,false);
    if (!bVar7) {
      auVar10 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::dtime_t,duckdb::dtime_t>
                (&local_48,(duckdb *)dVar4.micros,(dtime_t)auVar10._8_8_);
      duckdb::InvalidInputException::InvalidInputException(auVar10._0_8_,(string *)&local_48);
      __cxa_throw(auVar10._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error)
      ;
    }
  }
  else {
    if (iVar1 != iVar3 && iVar2 != iVar3) {
      uVar8 = (long)(iVar3 * 8 + iVar2 * -8) >> 3;
      lVar5 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      __comp_00._M_comp._17_7_ = local_48.field_2._M_allocated_capacity._1_7_;
      __comp_00._M_comp.desc = bVar7;
      __comp_00._M_comp.accessor_r = accessor;
      __comp_00._M_comp.accessor_l = accessor;
      std::
      __introselect<duckdb::dtime_t*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<duckdb::dtime_t>>>>
                (v_t + iVar2,v_t + iVar1,v_t + iVar3,(ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_00);
    }
    iVar1 = this->FRN;
    iVar2 = this->end;
    local_48._M_dataplus._M_p = (pointer)accessor;
    local_48._M_string_length = (size_type)accessor;
    local_48.field_2._M_local_buf[0] = bVar7;
    if (this->CRN != iVar2 && iVar1 != iVar2) {
      uVar8 = (long)(iVar2 * 8 + iVar1 * -8) >> 3;
      lVar5 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      __comp_01._M_comp._17_7_ = local_48.field_2._M_allocated_capacity._1_7_;
      __comp_01._M_comp.desc = bVar7;
      __comp_01._M_comp.accessor_r = accessor;
      __comp_01._M_comp.accessor_l = accessor;
      std::
      __introselect<duckdb::dtime_t*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<duckdb::dtime_t>>>>
                (v_t + iVar1,v_t + this->CRN,v_t + iVar2,(ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_01);
    }
    dVar4.micros = v_t[this->FRN].micros;
    bVar7 = duckdb::TryCast::Operation<duckdb::dtime_t,duckdb::dtime_t>(dVar4,&local_28,false);
    dVar6.micros = local_28.micros;
    if (!bVar7) {
      auVar10 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::dtime_t,duckdb::dtime_t>
                (&local_48,(duckdb *)dVar4.micros,(dtime_t)auVar10._8_8_);
      duckdb::InvalidInputException::InvalidInputException(auVar10._0_8_,(string *)&local_48);
      __cxa_throw(auVar10._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error)
      ;
    }
    dVar4.micros = v_t[this->CRN].micros;
    bVar7 = duckdb::TryCast::Operation<duckdb::dtime_t,duckdb::dtime_t>(dVar4,&local_28,false);
    if (!bVar7) {
      auVar10 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::dtime_t,duckdb::dtime_t>
                (&local_48,(duckdb *)dVar4.micros,(dtime_t)auVar10._8_8_);
      duckdb::InvalidInputException::InvalidInputException(auVar10._0_8_,(string *)&local_48);
      __cxa_throw(auVar10._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error)
      ;
    }
    dVar9 = this->RN -
            (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0));
    local_28.micros =
         llround(dVar9 * (double)local_28.micros + (1.0 - dVar9) * (double)dVar6.micros);
  }
  return (dtime_t)local_28.micros;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		if (CRN == FRN) {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
		} else {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			std::nth_element(v_t + FRN, v_t + CRN, v_t + end, comp);
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[CRN]), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}